

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator+=
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
          *x)

{
  uint uVar1;
  bool bVar2;
  uint ssize;
  int i;
  ulong uVar3;
  ulong uVar4;
  Fad<double> *pFVar5;
  value_type local_50;
  
  ssize = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
          ::size(&x->fadexpr_);
  if (ssize != 0) {
    uVar1 = *(uint *)(this + 0x28);
    if (uVar1 == 0) {
      Vector<Fad<double>_>::resize((Vector<Fad<double>_> *)(this + 0x28),ssize);
      pFVar5 = *(Fad<double> **)(this + 0x30);
      bVar2 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
              ::hasFastAccess(&x->fadexpr_);
      uVar1 = 0;
      if (0 < (int)ssize) {
        uVar1 = ssize;
      }
      uVar4 = 0;
      if (bVar2) {
        for (; uVar1 != uVar4; uVar4 = uVar4 + 1) {
          FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
          ::fastAccessDx(&local_50,&x->fadexpr_,(int)uVar4);
          Fad<double>::operator=(pFVar5,&local_50);
          Fad<double>::~Fad(&local_50);
          pFVar5 = pFVar5 + 1;
        }
      }
      else {
        for (; uVar1 != uVar4; uVar4 = uVar4 + 1) {
          FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
          ::dx(&local_50,&x->fadexpr_,(int)uVar4);
          Fad<double>::operator=(pFVar5,&local_50);
          Fad<double>::~Fad(&local_50);
          pFVar5 = pFVar5 + 1;
        }
      }
    }
    else {
      pFVar5 = *(Fad<double> **)(this + 0x30);
      bVar2 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
              ::hasFastAccess(&x->fadexpr_);
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      uVar3 = 0;
      if (bVar2) {
        for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
          ::fastAccessDx(&local_50,&x->fadexpr_,(int)uVar3);
          Fad<double>::operator+=<double,_nullptr>(pFVar5,&local_50);
          Fad<double>::~Fad(&local_50);
          pFVar5 = pFVar5 + 1;
        }
      }
      else {
        for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
          ::dx(&local_50,&x->fadexpr_,(int)uVar3);
          Fad<double>::operator+=<double,_nullptr>(pFVar5,&local_50);
          Fad<double>::~Fad(&local_50);
          pFVar5 = pFVar5 + 1;
        }
      }
    }
  }
  FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
  ::val(&local_50,&x->fadexpr_);
  Fad<double>::operator+=<double,_nullptr>((Fad<double> *)(this + 8),&local_50);
  Fad<double>::~Fad(&local_50);
  return (Fad<Fad<double>_> *)this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}